

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockTHUMB58Hc
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  undefined4 in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint8 y;
  uint8 x;
  uint8 block_mask [4] [4];
  uint8 distance;
  uint8 paint_colors [4] [3];
  uint8 colorsRGB444 [2] [3];
  uint8 colors [2] [3];
  uint col1;
  uint col0;
  byte local_5a;
  byte local_59;
  byte local_58 [27];
  byte local_3d;
  byte local_3c [12];
  byte local_30;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  uint8 local_2a [6];
  uint local_24;
  
  local_30 = (byte)(in_EDI >> 0x16) & 0xf;
  local_2f = (byte)(in_EDI >> 0x12) & 0xf;
  local_2e = (byte)(in_EDI >> 0xe) & 0xf;
  local_2d = (byte)(in_EDI >> 10) & 0xf;
  local_2c = (byte)(in_EDI >> 6) & 0xf;
  local_2b = (byte)(in_EDI >> 2) & 0xf;
  local_3d = (byte)((in_EDI & 3) << 1);
  uVar3 = in_EDI >> 0xe & 0xfff;
  local_24 = in_EDI >> 2 & 0xfff;
  if (local_24 <= uVar3) {
    local_3d = local_3d | 1;
  }
  decompressColor(4,4,4,(uint8 (*) [3])&local_30,(uint8 (*) [3])local_2a);
  calculatePaintColors58H
            ((uint8)((ulong)in_RDX >> 0x38),(uint8)((ulong)in_RDX >> 0x30),
             (uint8 (*) [3])CONCAT44(in_ECX,in_R8D),(uint8 (*) [3])CONCAT44(in_R9D,uVar3));
  for (local_59 = 0; local_59 < 4; local_59 = local_59 + 1) {
    for (local_5a = 0; local_5a < 4; local_5a = local_5a + 1) {
      local_58[(ulong)local_5a + (ulong)local_59 * 4] =
           (byte)((in_ESI >> (local_5a + local_59 * '\x04' + 0x10 & 0x1f) & 1) << 1);
      lVar2 = (ulong)local_59 * 4 + -0x58;
      local_58[(ulong)local_5a + lVar2 + 0x58] =
           local_58[(ulong)local_5a + lVar2 + 0x58] |
           (byte)(in_ESI >> (local_5a + local_59 * '\x04' & 0x1f)) & 1;
      if ((int)(uint)local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3] < 0) {
        bVar1 = 0;
      }
      else if (local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3] < 0x100) {
        bVar1 = local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3];
      }
      else {
        bVar1 = 0xff;
      }
      *(byte *)(in_RDX + (int)(in_stack_00000010 *
                              ((in_stack_00000008 + (uint)local_5a) * in_ECX + in_R9D +
                              (uint)local_59))) = bVar1;
      if ((int)(uint)local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3 + 1] < 0) {
        bVar1 = 0;
      }
      else if (local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3 + 1] < 0x100) {
        bVar1 = local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3 + 1];
      }
      else {
        bVar1 = 0xff;
      }
      *(byte *)(in_RDX + (int)(in_stack_00000010 *
                               ((in_stack_00000008 + (uint)local_5a) * in_ECX + in_R9D +
                               (uint)local_59) + 1)) = bVar1;
      if ((int)(uint)local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3 + 2] < 0) {
        bVar1 = 0;
      }
      else if (local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3 + 2] < 0x100) {
        bVar1 = local_3c[(ulong)local_58[(ulong)local_5a + (ulong)local_59 * 4] * 3 + 2];
      }
      else {
        bVar1 = 0xff;
      }
      *(byte *)(in_RDX + (int)(in_stack_00000010 *
                               ((in_stack_00000008 + (uint)local_5a) * in_ECX + in_R9D +
                               (uint)local_59) + 2)) = bVar1;
    }
  }
  return;
}

Assistant:

void decompressBlockTHUMB58Hc(unsigned int block_part1, unsigned int block_part2, uint8 *img, int width, int height, int startx, int starty, int channels)
{
	unsigned int col0, col1;
	uint8 colors[2][3];
	uint8 colorsRGB444[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];
	
	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 57);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 53);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 49);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 45);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 41);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 37);

	distance = 0;
	distance = (GETBITSHIGH(block_part1, 2, 33)) << 1;

	col0 = GETBITSHIGH(block_part1, 12, 57);
	col1 = GETBITSHIGH(block_part1, 12, 45);

	if(col0 >= col1)
	{
		distance |= 1;
	}

	// Extend the two colors to RGB888	
	decompressColor(R_BITS58H, G_BITS58H, B_BITS58H, colorsRGB444, colors);	
	
	calculatePaintColors58H(distance, PATTERN_H, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channels*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channels*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channels*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
		}
	}
}